

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void avgFinalize(sqlite3_context *context)

{
  double *pdVar1;
  double dVar2;
  
  if ((short)context->pMem->flags < 0) {
    pdVar1 = (double *)context->pMem->z;
  }
  else {
    pdVar1 = (double *)createAggContext(context,0);
  }
  if ((pdVar1 != (double *)0x0) && (0 < (long)pdVar1[3])) {
    if (*(char *)(pdVar1 + 4) == '\0') {
      dVar2 = (double)(long)pdVar1[2];
    }
    else {
      dVar2 = *pdVar1 + pdVar1[1];
    }
    sqlite3VdbeMemSetDouble(context->pOut,dVar2 / (double)(long)pdVar1[3]);
    return;
  }
  return;
}

Assistant:

static void avgFinalize(sqlite3_context *context){
  SumCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  if( p && p->cnt>0 ){
    double r;
    if( p->approx ){
      r = p->rSum+p->rErr;
    }else{
      r = (double)(p->iSum);
    }
    sqlite3_result_double(context, r/(double)p->cnt);
  }
}